

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_right_delim_join.cpp
# Opt level: O1

SinkCombineResultType __thiscall
duckdb::PhysicalRightDelimJoin::Combine
          (PhysicalRightDelimJoin *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  LocalSinkState *pLVar1;
  PhysicalOperator *pPVar2;
  PhysicalHashAggregate *pPVar3;
  OperatorSinkCombineInput distinct_combine_input;
  OperatorSinkCombineInput join_combine_input;
  type local_58;
  type local_50;
  InterruptState *local_48;
  type local_40;
  type local_38;
  InterruptState *local_30;
  
  pLVar1 = input->local_state;
  local_40 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&((this->super_PhysicalDelimJoin).join)->sink_state);
  local_38 = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
             operator*((unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                        *)(pLVar1 + 1));
  local_30 = input->interrupt_state;
  pPVar2 = (this->super_PhysicalDelimJoin).join;
  (*pPVar2->_vptr_PhysicalOperator[0x1b])(pPVar2,context,&local_40);
  local_58 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&(((this->super_PhysicalDelimJoin).distinct)->super_PhysicalOperator).
                          sink_state);
  local_50 = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
             operator*((unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                        *)&pLVar1[1].partition_info);
  local_48 = input->interrupt_state;
  pPVar3 = (this->super_PhysicalDelimJoin).distinct;
  (*(pPVar3->super_PhysicalOperator)._vptr_PhysicalOperator[0x1b])(pPVar3,context,&local_58);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalRightDelimJoin::Combine(ExecutionContext &context,
                                                      OperatorSinkCombineInput &input) const {
	auto &lstate = input.local_state.Cast<RightDelimJoinLocalState>();

	OperatorSinkCombineInput join_combine_input {*join.sink_state, *lstate.join_state, input.interrupt_state};
	join.Combine(context, join_combine_input);

	OperatorSinkCombineInput distinct_combine_input {*distinct.sink_state, *lstate.distinct_state,
	                                                 input.interrupt_state};
	distinct.Combine(context, distinct_combine_input);

	return SinkCombineResultType::FINISHED;
}